

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompress_template.h
# Opt level: O0

libdeflate_result
deflate_decompress_default
          (libdeflate_decompressor *d,void *in,size_t in_nbytes,void *out,size_t out_nbytes_avail,
          size_t *actual_in_nbytes_ret,size_t *actual_out_nbytes_ret)

{
  undefined1 uVar1;
  ushort uVar2;
  undefined2 uVar3;
  undefined4 uVar4;
  ulong uVar5;
  ulong uVar6;
  _Bool _Var7;
  uint uVar8;
  uint uVar9;
  byte *pbVar10;
  byte *pbVar11;
  ulong uVar12;
  ulong uVar13;
  ushort *puVar14;
  ushort *__src;
  byte *pbVar15;
  undefined8 uVar16;
  byte bVar17;
  byte *in_RCX;
  long in_RDX;
  byte *pbVar18;
  byte *in_RSI;
  long in_RDI;
  long in_R8;
  undefined8 *in_R9;
  long *in_stack_00000008;
  machine_word_t v_10;
  u8 *dst;
  u8 *src;
  u32 offset;
  u32 length;
  u32 entry_1;
  uint rep_count;
  u8 rep_val;
  uint presym;
  u32 entry;
  uint num_explicit_precode_lens;
  u32 tmp32;
  u16 tmp16;
  uint num_offset_syms;
  uint num_litlen_syms;
  u16 nlen;
  u16 len;
  uint block_type;
  uint is_final_block;
  uint i;
  size_t overrun_count;
  uint bitsleft;
  bitbuf_t bitbuf;
  u8 *in_end;
  u8 *in_next;
  u8 *out_end;
  u8 *out_next;
  machine_word_t v_11;
  u64 v_6;
  u64 v_5;
  u64 v_2;
  u64 v_1;
  u64 v;
  u16 v_3;
  u16 v_4;
  machine_word_t v_7;
  machine_word_t v_8;
  machine_word_t v_9;
  uint in_stack_fffffffffffffd88;
  uint in_stack_fffffffffffffd8c;
  uint in_stack_fffffffffffffd90;
  uint in_stack_fffffffffffffd94;
  byte *local_260;
  byte *local_258;
  uint local_248;
  uint local_244;
  uint local_214;
  ulong local_210;
  uint local_204;
  ulong local_200;
  byte *local_1f0;
  byte *local_1e0;
  libdeflate_result local_1a4;
  
  pbVar10 = in_RCX + in_R8;
  pbVar11 = in_RSI + in_RDX;
  local_200 = 0;
  local_204 = 0;
  local_210 = 0;
  local_1f0 = in_RSI;
  local_1e0 = in_RCX;
  do {
    if (local_204 < 0x11) {
      if ((ulong)((long)pbVar11 - (long)local_1f0) < 8) {
        do {
          if (local_1f0 == pbVar11) {
            local_210 = local_210 + 1;
          }
          else {
            local_200 = (ulong)*local_1f0 << ((byte)local_204 & 0x3f) | local_200;
            local_1f0 = local_1f0 + 1;
          }
          local_204 = local_204 + 8;
        } while (local_204 < 0x38);
      }
      else {
        local_200 = *(long *)local_1f0 << ((byte)local_204 & 0x3f) | local_200;
        local_1f0 = local_1f0 + (((ulong)local_204 ^ 0x3f) >> 3);
        local_204 = local_204 | 0x38;
      }
    }
    uVar5 = local_200 & 1;
    uVar8 = (uint)(local_200 >> 1) & 3;
    uVar12 = local_200 >> 3;
    uVar9 = local_204 - 3;
    if (uVar8 == 2) {
      uVar6 = local_200 >> 8;
      uVar13 = local_200 >> 0xd;
      local_200 = local_200 >> 0x11;
      local_204 = local_204 - 0x11;
      *(undefined1 *)(in_RDI + 0x1d60) = 0;
      for (local_214 = 0; local_214 < ((uint)uVar13 & 0xf) + 4; local_214 = local_214 + 1) {
        if (local_204 < 3) {
          if ((ulong)((long)pbVar11 - (long)local_1f0) < 8) {
            do {
              if (local_1f0 == pbVar11) {
                local_210 = local_210 + 1;
              }
              else {
                local_200 = (ulong)*local_1f0 << ((byte)local_204 & 0x3f) | local_200;
                local_1f0 = local_1f0 + 1;
              }
              local_204 = local_204 + 8;
            } while (local_204 < 0x38);
          }
          else {
            local_200 = *(long *)local_1f0 << ((byte)local_204 & 0x3f) | local_200;
            local_1f0 = local_1f0 + (((ulong)local_204 ^ 0x3f) >> 3);
            local_204 = local_204 | 0x38;
          }
        }
        bVar17 = (byte)local_200;
        local_200 = local_200 >> 3;
        local_204 = local_204 - 3;
        *(byte *)(in_RDI + (ulong)"\x10\x11\x12"[local_214]) = bVar17 & 7;
      }
      for (; local_214 < 0x13; local_214 = local_214 + 1) {
        *(undefined1 *)(in_RDI + (ulong)"\x10\x11\x12"[local_214]) = 0;
      }
      _Var7 = build_precode_decode_table
                        ((libdeflate_decompressor *)
                         CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
      if (((_Var7 ^ 0xffU) & 1) != 0) {
        return LIBDEFLATE_BAD_DATA;
      }
      local_214 = 0;
      while (local_214 < ((uint)uVar12 & 0x1f) + ((uint)uVar6 & 0x1f) + 0x102) {
        if (local_204 < 0xe) {
          if ((ulong)((long)pbVar11 - (long)local_1f0) < 8) {
            do {
              if (local_1f0 == pbVar11) {
                local_210 = local_210 + 1;
              }
              else {
                local_200 = (ulong)*local_1f0 << ((byte)local_204 & 0x3f) | local_200;
                local_1f0 = local_1f0 + 1;
              }
              local_204 = local_204 + 8;
            } while (local_204 < 0x38);
          }
          else {
            local_200 = *(long *)local_1f0 << ((byte)local_204 & 0x3f) | local_200;
            local_1f0 = local_1f0 + (((ulong)local_204 ^ 0x3f) >> 3);
            local_204 = local_204 | 0x38;
          }
        }
        uVar8 = *(uint *)(in_RDI + 0x1cc + (ulong)((uint)local_200 & 0x7f) * 4);
        local_200 = local_200 >> ((byte)uVar8 & 0x3f);
        local_204 = local_204 - (uVar8 & 0xff);
        uVar9 = uVar8 >> 8;
        if (uVar9 < 0x10) {
          *(char *)(in_RDI + (ulong)local_214) = (char)(uVar8 >> 8);
          local_214 = local_214 + 1;
        }
        else {
          uVar8 = (uint)local_200;
          if (uVar9 == 0x10) {
            if (local_214 == 0) {
              return LIBDEFLATE_BAD_DATA;
            }
            uVar1 = *(undefined1 *)(in_RDI + (ulong)(local_214 - 1));
            local_200 = local_200 >> 2;
            local_204 = local_204 - 2;
            local_244 = (uVar8 & 3) + 3;
            *(undefined1 *)(in_RDI + (ulong)local_214) = uVar1;
            *(undefined1 *)(in_RDI + (ulong)(local_214 + 1)) = uVar1;
            *(undefined1 *)(in_RDI + (ulong)(local_214 + 2)) = uVar1;
            *(undefined1 *)(in_RDI + (ulong)(local_214 + 3)) = uVar1;
            *(undefined1 *)(in_RDI + (ulong)(local_214 + 4)) = uVar1;
            *(undefined1 *)(in_RDI + (ulong)(local_214 + 5)) = uVar1;
          }
          else if (uVar9 == 0x11) {
            local_200 = local_200 >> 3;
            local_204 = local_204 - 3;
            local_244 = (uVar8 & 7) + 3;
            *(undefined1 *)(in_RDI + (ulong)local_214) = 0;
            *(undefined1 *)(in_RDI + (ulong)(local_214 + 1)) = 0;
            *(undefined1 *)(in_RDI + (ulong)(local_214 + 2)) = 0;
            *(undefined1 *)(in_RDI + (ulong)(local_214 + 3)) = 0;
            *(undefined1 *)(in_RDI + (ulong)(local_214 + 4)) = 0;
            *(undefined1 *)(in_RDI + (ulong)(local_214 + 5)) = 0;
            *(undefined1 *)(in_RDI + (ulong)(local_214 + 6)) = 0;
            *(undefined1 *)(in_RDI + (ulong)(local_214 + 7)) = 0;
            *(undefined1 *)(in_RDI + (ulong)(local_214 + 8)) = 0;
            *(undefined1 *)(in_RDI + (ulong)(local_214 + 9)) = 0;
          }
          else {
            local_200 = local_200 >> 7;
            local_204 = local_204 - 7;
            local_244 = (uVar8 & 0x7f) + 0xb;
            memset((void *)(in_RDI + (ulong)local_214),0,(ulong)local_244);
          }
          local_214 = local_244 + local_214;
        }
      }
LAB_00380364:
      _Var7 = build_offset_decode_table
                        ((libdeflate_decompressor *)
                         CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                         in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88);
      if (((_Var7 ^ 0xffU) & 1) != 0) {
        return LIBDEFLATE_BAD_DATA;
      }
      _Var7 = build_litlen_decode_table
                        ((libdeflate_decompressor *)
                         CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                         in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88);
      if (((_Var7 ^ 0xffU) & 1) != 0) {
        return LIBDEFLATE_BAD_DATA;
      }
LAB_003803d8:
      while( true ) {
        while( true ) {
          if (local_204 < 0xf) {
            if ((ulong)((long)pbVar11 - (long)local_1f0) < 8) {
              do {
                if (local_1f0 == pbVar11) {
                  local_210 = local_210 + 1;
                }
                else {
                  local_200 = (ulong)*local_1f0 << ((byte)local_204 & 0x3f) | local_200;
                  local_1f0 = local_1f0 + 1;
                }
                local_204 = local_204 + 8;
              } while (local_204 < 0x38);
            }
            else {
              local_200 = *(long *)local_1f0 << ((byte)local_204 & 0x3f) | local_200;
              local_1f0 = local_1f0 + (((ulong)local_204 ^ 0x3f) >> 3);
              local_204 = local_204 | 0x38;
            }
          }
          local_248 = *(uint *)(in_RDI + (ulong)((uint)local_200 & 0x3ff) * 4);
          if ((local_248 & 0x80000000) != 0) {
            local_200 = local_200 >> 10;
            local_204 = local_204 - 10;
            in_stack_fffffffffffffd94 = local_248 >> 8 & 0xffff;
            local_248 = *(uint *)(in_RDI + (ulong)(in_stack_fffffffffffffd94 +
                                                  ((uint)local_200 &
                                                  (1 << ((byte)local_248 & 0x1f)) - 1U)) * 4);
          }
          local_200 = local_200 >> ((byte)local_248 & 0x3f);
          local_204 = local_204 - (local_248 & 0xff);
          bVar17 = (byte)(local_248 >> 8);
          if ((local_248 & 0x40000000) == 0) break;
          if (local_1e0 == pbVar10) {
            return LIBDEFLATE_INSUFFICIENT_SPACE;
          }
          *local_1e0 = bVar17;
          local_1e0 = local_1e0 + 1;
        }
        if (local_204 < 0x38) {
          if ((ulong)((long)pbVar11 - (long)local_1f0) < 8) {
            do {
              if (local_1f0 == pbVar11) {
                local_210 = local_210 + 1;
              }
              else {
                local_200 = (ulong)*local_1f0 << ((byte)local_204 & 0x3f) | local_200;
                local_1f0 = local_1f0 + 1;
              }
              local_204 = local_204 + 8;
            } while (local_204 < 0x38);
          }
          else {
            local_200 = *(long *)local_1f0 << ((byte)local_204 & 0x3f) | local_200;
            local_1f0 = local_1f0 + (((ulong)local_204 ^ 0x3f) >> 3);
            local_204 = local_204 | 0x38;
          }
        }
        in_stack_fffffffffffffd90 = (uint)local_200;
        uVar12 = local_200 >> (bVar17 & 0x3f);
        local_204 = local_204 - (local_248 >> 8 & 0xff);
        uVar8 = (local_248 >> 0x10) + (in_stack_fffffffffffffd90 & (1 << (bVar17 & 0x1f)) - 1U);
        if ((ulong)((long)pbVar10 - (long)local_1e0) <= (ulong)uVar8 - 1) break;
        local_248 = *(uint *)(in_RDI + 0x14d8 + (ulong)((uint)uVar12 & 0xff) * 4);
        local_200 = uVar12;
        if ((local_248 & 0x80000000) != 0) {
          local_200 = uVar12 >> 8;
          local_204 = local_204 - 8;
          in_stack_fffffffffffffd8c = local_248 >> 8 & 0xffff;
          local_248 = *(uint *)(in_RDI + 0x14d8 +
                               (ulong)(in_stack_fffffffffffffd8c +
                                      ((uint)(uVar12 >> 8) & (1 << ((byte)local_248 & 0x1f)) - 1U))
                               * 4);
        }
        local_200 = local_200 >> ((byte)local_248 & 0x3f);
        in_stack_fffffffffffffd88 = (uint)local_200;
        bVar17 = (byte)(local_248 >> 0x18);
        local_200 = local_200 >> (bVar17 & 0x3f);
        local_204 = (local_204 - (local_248 & 0xff)) - (local_248 >> 0x18);
        uVar9 = (local_248 >> 8 & 0xffff) +
                (in_stack_fffffffffffffd88 & (1 << (bVar17 & 0x1f)) - 1U);
        if ((long)local_1e0 - (long)in_RCX < (long)(ulong)uVar9) {
          return LIBDEFLATE_BAD_DATA;
        }
        local_258 = local_1e0 + -(ulong)uVar9;
        pbVar15 = local_1e0 + uVar8;
        if ((long)pbVar10 - (long)pbVar15 < 0x15) {
          *local_1e0 = *local_258;
          local_1e0[1] = local_258[1];
          local_260 = local_1e0 + 2;
          local_258 = local_258 + 2;
          do {
            pbVar18 = local_260 + 1;
            *local_260 = *local_258;
            local_260 = pbVar18;
            local_258 = local_258 + 1;
            local_1e0 = pbVar15;
          } while (pbVar18 < pbVar15);
        }
        else if (uVar9 < 8) {
          if (uVar9 == 1) {
            uVar3 = CONCAT11(*local_258,*local_258);
            uVar4 = CONCAT22(uVar3,uVar3);
            uVar16 = CONCAT44(uVar4,uVar4);
            *(undefined8 *)local_1e0 = uVar16;
            *(undefined8 *)(local_1e0 + 8) = uVar16;
            local_260 = local_1e0 + 0x10;
            do {
              *(undefined8 *)local_260 = uVar16;
              local_260 = local_260 + 8;
              local_1e0 = pbVar15;
            } while (local_260 < pbVar15);
          }
          else {
            *local_1e0 = *local_258;
            local_1e0[1] = local_258[1];
            local_260 = local_1e0 + 2;
            local_258 = local_258 + 2;
            do {
              pbVar18 = local_260 + 1;
              *local_260 = *local_258;
              local_260 = pbVar18;
              local_258 = local_258 + 1;
              local_1e0 = pbVar15;
            } while (pbVar18 < pbVar15);
          }
        }
        else {
          *(undefined8 *)local_1e0 = *(undefined8 *)local_258;
          *(undefined8 *)(local_1e0 + 8) = *(undefined8 *)(local_258 + 8);
          local_258 = local_258 + 0x10;
          local_260 = local_1e0 + 0x10;
          do {
            *(undefined8 *)local_260 = *(undefined8 *)local_258;
            local_258 = local_258 + 8;
            local_260 = local_260 + 8;
            local_1e0 = pbVar15;
          } while (local_260 < pbVar15);
        }
      }
      local_200 = uVar12;
      if (uVar8 != 0) {
        return LIBDEFLATE_INSUFFICIENT_SPACE;
      }
    }
    else {
      if ((local_200 >> 1 & 3) != 0) {
        if (uVar8 != 1) {
          return LIBDEFLATE_BAD_DATA;
        }
        local_204 = uVar9;
        local_200 = uVar12;
        if ((*(byte *)(in_RDI + 0x1d60) & 1) == 0) {
          *(undefined1 *)(in_RDI + 0x1d60) = 1;
          for (local_214 = 0; local_214 < 0x90; local_214 = local_214 + 1) {
            *(undefined1 *)(in_RDI + (ulong)local_214) = 8;
          }
          for (; local_214 < 0x100; local_214 = local_214 + 1) {
            *(undefined1 *)(in_RDI + (ulong)local_214) = 9;
          }
          for (; local_214 < 0x118; local_214 = local_214 + 1) {
            *(undefined1 *)(in_RDI + (ulong)local_214) = 7;
          }
          for (; local_214 < 0x120; local_214 = local_214 + 1) {
            *(undefined1 *)(in_RDI + (ulong)local_214) = 8;
          }
          for (; local_214 < 0x140; local_214 = local_214 + 1) {
            *(undefined1 *)(in_RDI + (ulong)local_214) = 5;
          }
          goto LAB_00380364;
        }
        goto LAB_003803d8;
      }
      if (uVar9 >> 3 < local_210) {
        return LIBDEFLATE_BAD_DATA;
      }
      puVar14 = (ushort *)(local_1f0 + -((uVar9 >> 3) - local_210));
      local_210 = 0;
      local_200 = 0;
      local_204 = 0;
      if ((long)pbVar11 - (long)puVar14 < 4) {
        return LIBDEFLATE_BAD_DATA;
      }
      uVar2 = *puVar14;
      __src = puVar14 + 2;
      if (uVar2 != (puVar14[1] ^ 0xffff)) {
        return LIBDEFLATE_BAD_DATA;
      }
      if ((long)pbVar10 - (long)local_1e0 < (long)(ulong)uVar2) {
        return LIBDEFLATE_INSUFFICIENT_SPACE;
      }
      if ((long)pbVar11 - (long)__src < (long)(ulong)uVar2) {
        return LIBDEFLATE_BAD_DATA;
      }
      memcpy(local_1e0,__src,(ulong)uVar2);
      local_1f0 = (byte *)((long)__src + (long)(int)(uint)uVar2);
      local_1e0 = local_1e0 + (int)(uint)uVar2;
    }
    if (uVar5 != 0) {
      if (local_204 >> 3 < local_210) {
        local_1a4 = LIBDEFLATE_BAD_DATA;
      }
      else {
        if (in_R9 != (undefined8 *)0x0) {
          *in_R9 = local_1f0 + (-(long)in_RSI - ((local_204 >> 3) - local_210));
        }
        if (in_stack_00000008 == (long *)0x0) {
          if (local_1e0 != pbVar10) {
            return LIBDEFLATE_SHORT_OUTPUT;
          }
        }
        else {
          *in_stack_00000008 = (long)local_1e0 - (long)in_RCX;
        }
        local_1a4 = LIBDEFLATE_SUCCESS;
      }
      return local_1a4;
    }
  } while( true );
}

Assistant:

static enum libdeflate_result ATTRIBUTES
FUNCNAME(struct libdeflate_decompressor * restrict d,
	 const void * restrict in, size_t in_nbytes,
	 void * restrict out, size_t out_nbytes_avail,
	 size_t *actual_in_nbytes_ret, size_t *actual_out_nbytes_ret)
{
	u8 *out_next = out;
	u8 * const out_end = out_next + out_nbytes_avail;
	const u8 *in_next = in;
	const u8 * const in_end = in_next + in_nbytes;
	bitbuf_t bitbuf = 0;
	unsigned bitsleft = 0;
	size_t overrun_count = 0;
	unsigned i;
	unsigned is_final_block;
	unsigned block_type;
	u16 len;
	u16 nlen;
	unsigned num_litlen_syms;
	unsigned num_offset_syms;
	u16 tmp16;
	u32 tmp32;

next_block:
	/* Starting to read the next block.  */
	;

	STATIC_ASSERT(CAN_ENSURE(1 + 2 + 5 + 5 + 4));
	ENSURE_BITS(1 + 2 + 5 + 5 + 4);

	/* BFINAL: 1 bit  */
	is_final_block = POP_BITS(1);

	/* BTYPE: 2 bits  */
	block_type = POP_BITS(2);

	if (block_type == DEFLATE_BLOCKTYPE_DYNAMIC_HUFFMAN) {

		/* Dynamic Huffman block.  */

		/* The order in which precode lengths are stored.  */
		static const u8 deflate_precode_lens_permutation[DEFLATE_NUM_PRECODE_SYMS] = {
			16, 17, 18, 0, 8, 7, 9, 6, 10, 5, 11, 4, 12, 3, 13, 2, 14, 1, 15
		};

		unsigned num_explicit_precode_lens;

		/* Read the codeword length counts.  */

		STATIC_ASSERT(DEFLATE_NUM_LITLEN_SYMS == ((1 << 5) - 1) + 257);
		num_litlen_syms = POP_BITS(5) + 257;

		STATIC_ASSERT(DEFLATE_NUM_OFFSET_SYMS == ((1 << 5) - 1) + 1);
		num_offset_syms = POP_BITS(5) + 1;

		STATIC_ASSERT(DEFLATE_NUM_PRECODE_SYMS == ((1 << 4) - 1) + 4);
		num_explicit_precode_lens = POP_BITS(4) + 4;

		d->static_codes_loaded = false;

		/* Read the precode codeword lengths.  */
		STATIC_ASSERT(DEFLATE_MAX_PRE_CODEWORD_LEN == (1 << 3) - 1);
		for (i = 0; i < num_explicit_precode_lens; i++) {
			ENSURE_BITS(3);
			d->u.precode_lens[deflate_precode_lens_permutation[i]] = POP_BITS(3);
		}

		for (; i < DEFLATE_NUM_PRECODE_SYMS; i++)
			d->u.precode_lens[deflate_precode_lens_permutation[i]] = 0;

		/* Build the decode table for the precode.  */
		SAFETY_CHECK(build_precode_decode_table(d));

		/* Expand the literal/length and offset codeword lengths.  */
		for (i = 0; i < num_litlen_syms + num_offset_syms; ) {
			u32 entry;
			unsigned presym;
			u8 rep_val;
			unsigned rep_count;

			ENSURE_BITS(DEFLATE_MAX_PRE_CODEWORD_LEN + 7);

			/* (The code below assumes that the precode decode table
			 * does not have any subtables.)  */
			STATIC_ASSERT(PRECODE_TABLEBITS == DEFLATE_MAX_PRE_CODEWORD_LEN);

			/* Read the next precode symbol.  */
			entry = d->u.l.precode_decode_table[BITS(DEFLATE_MAX_PRE_CODEWORD_LEN)];
			REMOVE_BITS(entry & HUFFDEC_LENGTH_MASK);
			presym = entry >> HUFFDEC_RESULT_SHIFT;

			if (presym < 16) {
				/* Explicit codeword length  */
				d->u.l.lens[i++] = presym;
				continue;
			}

			/* Run-length encoded codeword lengths  */

			/* Note: we don't need verify that the repeat count
			 * doesn't overflow the number of elements, since we
			 * have enough extra spaces to allow for the worst-case
			 * overflow (138 zeroes when only 1 length was
			 * remaining).
			 *
			 * In the case of the small repeat counts (presyms 16
			 * and 17), it is fastest to always write the maximum
			 * number of entries.  That gets rid of branches that
			 * would otherwise be required.
			 *
			 * It is not just because of the numerical order that
			 * our checks go in the order 'presym < 16', 'presym ==
			 * 16', and 'presym == 17'.  For typical data this is
			 * ordered from most frequent to least frequent case.
			 */
			STATIC_ASSERT(DEFLATE_MAX_LENS_OVERRUN == 138 - 1);

			if (presym == 16) {
				/* Repeat the previous length 3 - 6 times  */
				SAFETY_CHECK(i != 0);
				rep_val = d->u.l.lens[i - 1];
				STATIC_ASSERT(3 + ((1 << 2) - 1) == 6);
				rep_count = 3 + POP_BITS(2);
				d->u.l.lens[i + 0] = rep_val;
				d->u.l.lens[i + 1] = rep_val;
				d->u.l.lens[i + 2] = rep_val;
				d->u.l.lens[i + 3] = rep_val;
				d->u.l.lens[i + 4] = rep_val;
				d->u.l.lens[i + 5] = rep_val;
				i += rep_count;
			} else if (presym == 17) {
				/* Repeat zero 3 - 10 times  */
				STATIC_ASSERT(3 + ((1 << 3) - 1) == 10);
				rep_count = 3 + POP_BITS(3);
				d->u.l.lens[i + 0] = 0;
				d->u.l.lens[i + 1] = 0;
				d->u.l.lens[i + 2] = 0;
				d->u.l.lens[i + 3] = 0;
				d->u.l.lens[i + 4] = 0;
				d->u.l.lens[i + 5] = 0;
				d->u.l.lens[i + 6] = 0;
				d->u.l.lens[i + 7] = 0;
				d->u.l.lens[i + 8] = 0;
				d->u.l.lens[i + 9] = 0;
				i += rep_count;
			} else {
				/* Repeat zero 11 - 138 times  */
				STATIC_ASSERT(11 + ((1 << 7) - 1) == 138);
				rep_count = 11 + POP_BITS(7);
				memset(&d->u.l.lens[i], 0,
				       rep_count * sizeof(d->u.l.lens[i]));
				i += rep_count;
			}
		}
	} else if (block_type == DEFLATE_BLOCKTYPE_UNCOMPRESSED) {

		/* Uncompressed block: copy 'len' bytes literally from the input
		 * buffer to the output buffer.  */

		ALIGN_INPUT();

		SAFETY_CHECK(in_end - in_next >= 4);

		len = READ_U16();
		nlen = READ_U16();

		SAFETY_CHECK(len == (u16)~nlen);
		if (unlikely(len > out_end - out_next))
			return LIBDEFLATE_INSUFFICIENT_SPACE;
		SAFETY_CHECK(len <= in_end - in_next);

		memcpy(out_next, in_next, len);
		in_next += len;
		out_next += len;

		goto block_done;

	} else {
		SAFETY_CHECK(block_type == DEFLATE_BLOCKTYPE_STATIC_HUFFMAN);

		/*
		 * Static Huffman block: build the decode tables for the static
		 * codes.  Skip doing so if the tables are already set up from
		 * an earlier static block; this speeds up decompression of
		 * degenerate input of many empty or very short static blocks.
		 *
		 * Afterwards, the remainder is the same as decompressing a
		 * dynamic Huffman block.
		 */

		if (d->static_codes_loaded)
			goto have_decode_tables;

		d->static_codes_loaded = true;

		STATIC_ASSERT(DEFLATE_NUM_LITLEN_SYMS == 288);
		STATIC_ASSERT(DEFLATE_NUM_OFFSET_SYMS == 32);

		for (i = 0; i < 144; i++)
			d->u.l.lens[i] = 8;
		for (; i < 256; i++)
			d->u.l.lens[i] = 9;
		for (; i < 280; i++)
			d->u.l.lens[i] = 7;
		for (; i < 288; i++)
			d->u.l.lens[i] = 8;

		for (; i < 288 + 32; i++)
			d->u.l.lens[i] = 5;

		num_litlen_syms = 288;
		num_offset_syms = 32;
	}

	/* Decompressing a Huffman block (either dynamic or static)  */

	SAFETY_CHECK(build_offset_decode_table(d, num_litlen_syms, num_offset_syms));
	SAFETY_CHECK(build_litlen_decode_table(d, num_litlen_syms, num_offset_syms));
have_decode_tables:

	/* The main DEFLATE decode loop  */
	for (;;) {
		u32 entry;
		u32 length;
		u32 offset;
		const u8 *src;
		u8 *dst;

		/* Decode a litlen symbol.  */
		ENSURE_BITS(DEFLATE_MAX_LITLEN_CODEWORD_LEN);
		entry = d->u.litlen_decode_table[BITS(LITLEN_TABLEBITS)];
		if (entry & HUFFDEC_SUBTABLE_POINTER) {
			/* Litlen subtable required (uncommon case)  */
			REMOVE_BITS(LITLEN_TABLEBITS);
			entry = d->u.litlen_decode_table[
				((entry >> HUFFDEC_RESULT_SHIFT) & 0xFFFF) +
				BITS(entry & HUFFDEC_LENGTH_MASK)];
		}
		REMOVE_BITS(entry & HUFFDEC_LENGTH_MASK);
		if (entry & HUFFDEC_LITERAL) {
			/* Literal  */
			if (unlikely(out_next == out_end))
				return LIBDEFLATE_INSUFFICIENT_SPACE;
			*out_next++ = (u8)(entry >> HUFFDEC_RESULT_SHIFT);
			continue;
		}

		/* Match or end-of-block  */

		entry >>= HUFFDEC_RESULT_SHIFT;
		ENSURE_BITS(MAX_ENSURE);

		/* Pop the extra length bits and add them to the length base to
		 * produce the full length.  */
		length = (entry >> HUFFDEC_LENGTH_BASE_SHIFT) +
			 POP_BITS(entry & HUFFDEC_EXTRA_LENGTH_BITS_MASK);

		/* The match destination must not end after the end of the
		 * output buffer.  For efficiency, combine this check with the
		 * end-of-block check.  We're using 0 for the special
		 * end-of-block length, so subtract 1 and it turn it into
		 * SIZE_MAX.  */
		STATIC_ASSERT(HUFFDEC_END_OF_BLOCK_LENGTH == 0);
		if (unlikely((size_t)length - 1 >= out_end - out_next)) {
			if (unlikely(length != HUFFDEC_END_OF_BLOCK_LENGTH))
				return LIBDEFLATE_INSUFFICIENT_SPACE;
			goto block_done;
		}

		/* Decode the match offset.  */

		entry = d->offset_decode_table[BITS(OFFSET_TABLEBITS)];
		if (entry & HUFFDEC_SUBTABLE_POINTER) {
			/* Offset subtable required (uncommon case)  */
			REMOVE_BITS(OFFSET_TABLEBITS);
			entry = d->offset_decode_table[
				((entry >> HUFFDEC_RESULT_SHIFT) & 0xFFFF) +
				BITS(entry & HUFFDEC_LENGTH_MASK)];
		}
		REMOVE_BITS(entry & HUFFDEC_LENGTH_MASK);
		entry >>= HUFFDEC_RESULT_SHIFT;

		STATIC_ASSERT(CAN_ENSURE(DEFLATE_MAX_EXTRA_LENGTH_BITS +
					 DEFLATE_MAX_OFFSET_CODEWORD_LEN) &&
			      CAN_ENSURE(DEFLATE_MAX_EXTRA_OFFSET_BITS));
		if (!CAN_ENSURE(DEFLATE_MAX_EXTRA_LENGTH_BITS +
				DEFLATE_MAX_OFFSET_CODEWORD_LEN +
				DEFLATE_MAX_EXTRA_OFFSET_BITS))
			ENSURE_BITS(DEFLATE_MAX_EXTRA_OFFSET_BITS);

		/* Pop the extra offset bits and add them to the offset base to
		 * produce the full offset.  */
		offset = (entry & HUFFDEC_OFFSET_BASE_MASK) +
			 POP_BITS(entry >> HUFFDEC_EXTRA_OFFSET_BITS_SHIFT);

		/* The match source must not begin before the beginning of the
		 * output buffer.  */
		SAFETY_CHECK(offset <= out_next - (const u8 *)out);

		/*
		 * Copy the match: 'length' bytes at 'out_next - offset' to
		 * 'out_next', possibly overlapping.  If the match doesn't end
		 * too close to the end of the buffer and offset >= WORDBYTES ||
		 * offset == 1, take a fast path which copies a word at a time
		 * -- potentially more than the length of the match, but that's
		 * fine as long as we check for enough extra space.
		 *
		 * The remaining cases are not performance-critical so are
		 * handled by a simple byte-by-byte copy.
		 */

		src = out_next - offset;
		dst = out_next;
		out_next += length;

		if (UNALIGNED_ACCESS_IS_FAST &&
		    /* max overrun is writing 3 words for a min length match */
		    likely(out_end - out_next >=
			   3 * WORDBYTES - DEFLATE_MIN_MATCH_LEN)) {
			if (offset >= WORDBYTES) { /* words don't overlap? */
				copy_word_unaligned(src, dst);
				src += WORDBYTES;
				dst += WORDBYTES;
				copy_word_unaligned(src, dst);
				src += WORDBYTES;
				dst += WORDBYTES;
				do {
					copy_word_unaligned(src, dst);
					src += WORDBYTES;
					dst += WORDBYTES;
				} while (dst < out_next);
			} else if (offset == 1) {
				/* RLE encoding of previous byte, common if the
				 * data contains many repeated bytes */
				machine_word_t v = repeat_byte(*src);

				store_word_unaligned(v, dst);
				dst += WORDBYTES;
				store_word_unaligned(v, dst);
				dst += WORDBYTES;
				do {
					store_word_unaligned(v, dst);
					dst += WORDBYTES;
				} while (dst < out_next);
			} else {
				*dst++ = *src++;
				*dst++ = *src++;
				do {
					*dst++ = *src++;
				} while (dst < out_next);
			}
		} else {
			STATIC_ASSERT(DEFLATE_MIN_MATCH_LEN == 3);
			*dst++ = *src++;
			*dst++ = *src++;
			do {
				*dst++ = *src++;
			} while (dst < out_next);
		}
	}

block_done:
	/* Finished decoding a block.  */

	if (!is_final_block)
		goto next_block;

	/* That was the last block.  */

	/* Discard any readahead bits and check for excessive overread */
	ALIGN_INPUT();

	/* Optionally return the actual number of bytes read */
	if (actual_in_nbytes_ret)
		*actual_in_nbytes_ret = in_next - (u8 *)in;

	/* Optionally return the actual number of bytes written */
	if (actual_out_nbytes_ret) {
		*actual_out_nbytes_ret = out_next - (u8 *)out;
	} else {
		if (out_next != out_end)
			return LIBDEFLATE_SHORT_OUTPUT;
	}
	return LIBDEFLATE_SUCCESS;
}